

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::EnumOptions::_InternalParse(EnumOptions *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  Rep *pRVar5;
  UninterpretedOption *msg;
  ulong uVar6;
  char cVar7;
  uint32 res;
  uint tag;
  uint uVar8;
  int iVar9;
  uint uVar10;
  pair<const_char_*,_unsigned_int> pVar11;
  pair<const_char_*,_unsigned_long> pVar12;
  pair<const_char_*,_bool> pVar13;
  
  uVar10 = 0;
LAB_001741f9:
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) goto LAB_00174447;
      pVar13 = internal::EpsCopyInputStream::DoneFallback
                         (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      ptr = pVar13.first;
      if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_00174447;
    }
    bVar1 = *ptr;
    pVar11.second._0_1_ = bVar1;
    pVar11.first = (char *)((byte *)ptr + 1);
    pVar11._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar11 = internal::ReadTagFallback(ptr,res);
        if (pVar11.first == (char *)0x0) goto LAB_0017445a;
      }
      else {
        pVar11.second = res;
        pVar11.first = (char *)((byte *)ptr + 2);
        pVar11._12_4_ = 0;
      }
    }
    ptr = pVar11.first;
    tag = pVar11.second;
    uVar8 = (uint)(pVar11._8_8_ >> 3) & 0x1fffffff;
    cVar7 = (char)pVar11.second;
    if (uVar8 == 999) {
      if (cVar7 == ':') {
        ptr = (char *)((byte *)ptr + -2);
        do {
          pRVar5 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar5 == (Rep *)0x0) {
            iVar9 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_;
LAB_00174306:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,iVar9 + 1);
            pRVar5 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            iVar9 = pRVar5->allocated_size;
LAB_00174316:
            pRVar5->allocated_size = iVar9 + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                            ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_);
            pRVar5 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            iVar9 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar9 + 1;
            pRVar5->elements[iVar9] = msg;
          }
          else {
            iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            iVar9 = pRVar5->allocated_size;
            if (iVar9 <= iVar3) {
              if (iVar9 == (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_00174306;
              goto LAB_00174316;
            }
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg = (UninterpretedOption *)pRVar5->elements[iVar3];
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                          (ctx,msg,(char *)((byte *)ptr + 2));
          if ((byte *)ptr == (byte *)0x0) goto LAB_0017445a;
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*(short *)ptr == 0x3eba));
        goto LAB_001741f9;
      }
LAB_00174390:
      if ((tag == 0) || ((tag & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        goto LAB_00174447;
      }
      if (tag < 8000) {
        ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
      }
      else {
        ptr = internal::ExtensionSet::ParseField
                        (&this->_extensions_,pVar11._8_8_ & 0xffffffff,ptr,
                         (Message *)_EnumOptions_default_instance_,&this->_internal_metadata_,ctx);
      }
    }
    else {
      if (uVar8 == 3) {
        if (cVar7 != '\x18') goto LAB_00174390;
        uVar10 = uVar10 | 2;
        uVar6 = (ulong)*ptr;
        pbVar4 = (byte *)ptr + 1;
        if ((long)uVar6 < 0) {
          bVar1 = ((byte *)ptr)[1];
          uVar8 = ((uint)bVar1 * 0x80 + (uint)(byte)*ptr) - 0x80;
          if ((char)bVar1 < '\0') {
            pVar12 = internal::VarintParseSlow64(ptr,uVar8);
            ptr = pVar12.first;
            this->deprecated_ = pVar12.second != 0;
            goto LAB_001743de;
          }
          uVar6 = (ulong)uVar8;
          pbVar4 = (byte *)ptr + 2;
        }
        ptr = (char *)pbVar4;
        this->deprecated_ = uVar6 != 0;
        goto LAB_001741f9;
      }
      if ((uVar8 != 2) || (cVar7 != '\x10')) goto LAB_00174390;
      uVar10 = uVar10 | 1;
      uVar6 = (ulong)*ptr;
      pbVar4 = (byte *)ptr + 1;
      if (-1 < (long)uVar6) {
LAB_00174296:
        this->allow_alias_ = uVar6 != 0;
        ptr = (char *)pbVar4;
        goto LAB_001741f9;
      }
      uVar8 = ((uint)*pbVar4 * 0x80 + (uint)(byte)*ptr) - 0x80;
      if (-1 < (char)*pbVar4) {
        uVar6 = (ulong)uVar8;
        pbVar4 = (byte *)ptr + 2;
        goto LAB_00174296;
      }
      pVar12 = internal::VarintParseSlow64(ptr,uVar8);
      ptr = pVar12.first;
      this->allow_alias_ = pVar12.second != 0;
    }
LAB_001743de:
    if ((byte *)ptr == (byte *)0x0) {
LAB_0017445a:
      ptr = (char *)0x0;
LAB_00174447:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar10;
      return ptr;
    }
  } while( true );
}

Assistant:

const char* EnumOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional bool allow_alias = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_allow_alias(&has_bits);
          allow_alias_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool deprecated = 3 [default = false];
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}